

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

int __thiscall QListModeViewBase::horizontalOffset(QListModeViewBase *this)

{
  Flow FVar1;
  QListViewPrivate *pQVar2;
  long lVar3;
  ScrollMode SVar4;
  int iVar5;
  uint uVar6;
  LayoutDirection LVar7;
  int iVar8;
  QScrollBar *pQVar9;
  ulong uVar10;
  uint uVar11;
  
  SVar4 = QAbstractItemView::horizontalScrollMode
                    ((QAbstractItemView *)(this->super_QCommonListViewBase).qq);
  if (SVar4 == ScrollPerItem) {
    pQVar2 = (this->super_QCommonListViewBase).dd;
    FVar1 = pQVar2->flow;
    if (pQVar2->wrap == true) {
      if ((FVar1 == TopToBottom) && (lVar3 = (this->segmentPositions).d.size, lVar3 != 0)) {
        uVar11 = (int)lVar3 - 1;
        pQVar9 = QAbstractScrollArea::horizontalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        uVar6 = QAbstractSlider::value(&pQVar9->super_QAbstractSlider);
        if ((int)uVar11 < (int)uVar6) {
          uVar6 = uVar11;
        }
        uVar10 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar10 = 0;
        }
        iVar5 = (this->segmentPositions).d.ptr[uVar10];
        pQVar9 = QAbstractScrollArea::horizontalScrollBar
                           ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
        uVar6 = QAbstractSlider::maximum(&pQVar9->super_QAbstractSlider);
        if ((int)uVar6 <= (int)uVar11) {
          uVar11 = uVar6;
        }
        uVar10 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar10 = 0;
        }
        iVar8 = (this->segmentPositions).d.ptr[uVar10];
        LVar7 = QWidget::layoutDirection((QWidget *)(this->super_QCommonListViewBase).qq);
        iVar8 = iVar8 - iVar5;
        if (LVar7 != RightToLeft) {
          iVar8 = iVar5;
        }
        return iVar8;
      }
    }
    else if ((FVar1 == LeftToRight) && ((this->flowPositions).d.size != 0)) {
      pQVar9 = QAbstractScrollArea::horizontalScrollBar
                         ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
      iVar5 = QAbstractSlider::value(&pQVar9->super_QAbstractSlider);
      iVar5 = (this->flowPositions).d.ptr[(this->scrollValueMap).d.ptr[iVar5]];
      pQVar9 = QAbstractScrollArea::horizontalScrollBar
                         ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
      iVar8 = QAbstractSlider::maximum(&pQVar9->super_QAbstractSlider);
      iVar8 = (this->flowPositions).d.ptr[(this->scrollValueMap).d.ptr[iVar8]];
      LVar7 = QWidget::layoutDirection((QWidget *)(this->super_QCommonListViewBase).qq);
      if (LVar7 == RightToLeft) {
        return iVar8 - iVar5;
      }
      return iVar5;
    }
  }
  iVar5 = QCommonListViewBase::horizontalOffset(&this->super_QCommonListViewBase);
  return iVar5;
}

Assistant:

int QListModeViewBase::horizontalOffset() const
{
    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
        if (isWrapping()) {
            if (flow() == QListView::TopToBottom && !segmentPositions.isEmpty()) {
                const int max = segmentPositions.size() - 1;
                int currentValue = qBound(0, horizontalScrollBar()->value(), max);
                int position = segmentPositions.at(currentValue);
                int maximumValue = qBound(0, horizontalScrollBar()->maximum(), max);
                int maximum = segmentPositions.at(maximumValue);
                return (isRightToLeft() ? maximum - position : position);
            }
        } else if (flow() == QListView::LeftToRight && !flowPositions.isEmpty()) {
            int position = flowPositions.at(scrollValueMap.at(horizontalScrollBar()->value()));
            int maximum = flowPositions.at(scrollValueMap.at(horizontalScrollBar()->maximum()));
            return (isRightToLeft() ? maximum - position : position);
        }
    }
    return QCommonListViewBase::horizontalOffset();
}